

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarCheckTrivial(Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  int nRealPis;
  void *pvVar2;
  Abc_Cex_t *pAVar3;
  uint local_2c;
  int i;
  Aig_Obj_t *pObj;
  int fVerbose_local;
  Aig_Man_t *pAig_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Saig_ManPoNum(pAig);
    if (iVar1 <= (int)local_2c) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry(pAig->vCos,local_2c);
    if ((pAig->nConstrs != 0) &&
       (iVar1 = Saig_ManPoNum(pAig), iVar1 - pAig->nConstrs <= (int)local_2c)) break;
    if ((*(ulong *)((long)pvVar2 + 0x18) >> 3 & 1) != 0) {
      if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pAig->pSeqModel);
        pAig->pSeqModel = (Abc_Cex_t *)0x0;
      }
      iVar1 = Aig_ManRegNum(pAig);
      nRealPis = Saig_ManPiNum(pAig);
      pAVar3 = Abc_CexAlloc(iVar1,nRealPis,1);
      pAig->pSeqModel = pAVar3;
      pAig->pSeqModel->iPo = local_2c;
      if (fVerbose != 0) {
        Abc_Print(1,"Output %d is trivally SAT in frame 0. \n",(ulong)local_2c);
      }
      return 1;
    }
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Ssw_RarCheckTrivial( Aig_Man_t * pAig, int fVerbose )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( pAig->nConstrs && i >= Saig_ManPoNum(pAig) - pAig->nConstrs )
            return 0;
        if ( pObj->fPhase )
        {
            ABC_FREE( pAig->pSeqModel );
            pAig->pSeqModel = Abc_CexAlloc( Aig_ManRegNum(pAig), Saig_ManPiNum(pAig), 1 );
            pAig->pSeqModel->iPo = i;
            if ( fVerbose )
                Abc_Print( 1, "Output %d is trivally SAT in frame 0. \n", i );
            return 1;
        }
    }
    return 0;
}